

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::ProcessSecondChanceBoundary(LinearScan *this,BranchInstr *branchInstr)

{
  Kind KVar1;
  long *plVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Type *ppLVar7;
  Type pLVar8;
  MultiBranchInstr *pMVar9;
  long lVar10;
  Type_conflict pBVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  void **value;
  anon_class_16_1_3fcf6586_for_fn local_98;
  anon_class_16_2_f2001897 local_88;
  anon_class_16_1_3fcf6586_for_fn local_78;
  BVSparse<Memory::JitArenaAllocator> local_68;
  BranchInstr *local_40;
  LinearScan *local_38;
  
  BVar5 = Func::HasTry(this->func);
  if ((BVar5 == 0) || (bVar4 = Func::DoOptimizeTry(this->func), bVar4)) {
    if ((this->currentOpHelperBlock != (OpHelperBlock *)0x0) &&
       ((BranchInstr *)this->currentOpHelperBlock->opHelperEndInstr == branchInstr)) {
      pBVar11 = (Type_conflict)this->opHelperSpilledLiveranges;
      local_68.head = pBVar11;
      local_68.lastFoundIndex = pBVar11;
      local_40 = branchInstr;
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      while( true ) {
        if (pBVar11 == (Type_conflict)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar4) goto LAB_0052f4e7;
          *puVar6 = 0;
          pBVar11 = local_68.lastFoundIndex;
        }
        pBVar11 = (Type_conflict)
                  (((SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount> *)&pBVar11->next)->
                  super_SListNodeBase<Memory::ArenaAllocator>).next;
        branchInstr = local_40;
        if (pBVar11 == local_68.head) break;
        local_68.lastFoundIndex = pBVar11;
        ppLVar7 = SListBase<Lifetime_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&local_68);
        pLVar8 = *ppLVar7;
        pBVar11 = local_68.lastFoundIndex;
        if ((*(ushort *)&pLVar8->field_0x9c & 0x40) == 0) {
          if ((*(ushort *)&pLVar8->field_0x9c >> 9 & 1) != 0) {
            BVUnitT<unsigned_long>::Set(&this->secondChanceRegs,(uint)pLVar8->reg);
            pLVar8 = *ppLVar7;
          }
          this->regContent[pLVar8->reg] = pLVar8;
          pBVar11 = local_68.lastFoundIndex;
        }
      }
    }
    bVar4 = IR::BranchInstr::IsMultiBranch(branchInstr);
    if (bVar4) {
      pMVar9 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
      local_78.fn.fn = &local_88;
      local_68.alloc = ((pMVar9->super_BranchInstr).super_Instr.m_func)->m_alloc;
      local_78.fn.visitedTargets = &local_68;
      local_68.head = (Type_conflict)0x0;
      local_68.lastFoundIndex = (Type_conflict)0x0;
      plVar2 = (long *)pMVar9->m_branchTargets;
      local_88.this = this;
      local_88.branchInstr = branchInstr;
      local_68.lastUsedNodePrevNextField = &(local_78.fn.visitedTargets)->head;
      if (plVar2 != (long *)0x0) {
        KVar1 = pMVar9->m_kind;
        if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
          lVar10 = pMVar9->m_baseCaseValue;
          lVar14 = lVar10 * 8 + *plVar2;
          local_40 = branchInstr;
          local_38 = this;
          for (; lVar10 <= pMVar9->m_lastCaseValue; lVar10 = lVar10 + 1) {
            anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
            anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                      (&local_78,(void **)(lVar14 + pMVar9->m_baseCaseValue * -8));
            lVar14 = lVar14 + 8;
          }
          value = (void **)(plVar2 + 1);
          branchInstr = local_40;
          this = local_38;
        }
        else if (KVar1 == StrDictionary) {
          local_98.fn.visitedTargets = local_78.fn.visitedTargets;
          local_98.fn.fn = local_78.fn.fn;
          local_38 = this;
          for (uVar12 = 0; uVar12 < *(uint *)((long)plVar2 + 0x1c); uVar12 = uVar12 + 1) {
            iVar13 = *(int *)(*plVar2 + uVar12 * 4);
            if (iVar13 != -1) {
              while (iVar13 != -1) {
                lVar10 = (long)iVar13;
                iVar13 = *(int *)(plVar2[1] + 8 + lVar10 * 0x18);
                anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
                anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                          (&local_98,(void **)(plVar2[1] + lVar10 * 0x18));
              }
            }
          }
          value = (void **)(plVar2 + 7);
          this = local_38;
        }
        else {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar6 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x435,"(false)","false");
          if (!bVar4) {
LAB_0052f4e7:
            pcVar3 = (code *)invalidInstructionException();
            (*pcVar3)();
          }
          *puVar6 = 0;
          value = (void **)0x0;
        }
        anon_func::anon_class_16_1_3fcf6586::anon_class_16_1_3fcf6586_for_fn::
        anon_class_16_1_3fcf6586_for_fn::anon_class_16_1_3fcf6586_for_fn::operator()
                  (&local_78,value);
      }
      BVSparse<Memory::JitArenaAllocator>::~BVSparse(&local_68);
    }
    else {
      ProcessSecondChanceBoundaryHelper(this,branchInstr,branchInstr->m_branchTarget);
    }
    SaveRegContent(this,&branchInstr->super_Instr);
  }
  return;
}

Assistant:

void
LinearScan::ProcessSecondChanceBoundary(IR::BranchInstr *branchInstr)
{
    if (this->func->HasTry() && !this->func->DoOptimizeTry())
    {
        return;
    }

    if (this->currentOpHelperBlock && this->currentOpHelperBlock->opHelperEndInstr == branchInstr)
    {
        // Lifetimes opHelperSpilled won't get recorded by SaveRegContent().  Do it here.
        FOREACH_SLIST_ENTRY(Lifetime *, lifetime, this->opHelperSpilledLiveranges)
        {
            if (!lifetime->cantOpHelperSpill)
            {
                if (lifetime->isSecondChanceAllocated)
                {
                    this->secondChanceRegs.Set(lifetime->reg);
                }
                this->regContent[lifetime->reg] = lifetime;
            }
        } NEXT_SLIST_ENTRY;
    }

    if(branchInstr->IsMultiBranch())
    {
        IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();

        multiBranchInstr->MapUniqueMultiBrLabels([=](IR::LabelInstr * branchLabel) -> void
        {
            this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
        });
    }
    else
    {
        IR::LabelInstr *branchLabel = branchInstr->GetTarget();
        this->ProcessSecondChanceBoundaryHelper(branchInstr, branchLabel);
    }

    this->SaveRegContent(branchInstr);
}